

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O1

int parsedate(char *date,time_t *output)

{
  byte *pbVar1;
  byte bVar2;
  char *__s;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  int *piVar9;
  long slnum;
  size_t sVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  tzinfo *__s_00;
  int iVar15;
  int iVar16;
  ulong max;
  char **ppcVar17;
  bool bVar18;
  bool bVar19;
  char *end;
  int local_78;
  int local_6c;
  int local_68;
  int local_64;
  byte *local_48;
  long *local_40;
  byte *local_38;
  
  bVar19 = false;
  local_78 = -1;
  local_68 = -1;
  local_6c = -1;
  iVar3 = -1;
  iVar14 = -1;
  local_64 = -1;
  iVar16 = 0;
  iVar13 = -1;
  iVar12 = -1;
  local_40 = output;
  local_38 = (byte *)date;
  do {
    iVar5 = local_78;
    bVar2 = *date;
    if ((bVar2 == 0) || (5 < iVar16)) {
      if (local_6c == -1) {
        local_78 = 0;
        local_68 = 0;
        local_6c = 0;
      }
      if (local_64 == -1) {
        return -1;
      }
      if (iVar13 == -1) {
        return -1;
      }
      if (iVar3 < 0x62f) {
        return -1;
      }
      if (0x1f < local_64) {
        return -1;
      }
      if (0xb < iVar13) {
        return -1;
      }
      if (0x17 < local_78) {
        return -1;
      }
      if (0x3b < local_68) {
        return -1;
      }
      if (0x3c < local_6c) {
        return -1;
      }
      uVar11 = iVar3 - (uint)(iVar13 < 2);
      if (iVar14 == -1) {
        iVar14 = 0;
      }
      *local_40 = ((long)local_68 +
                  ((long)local_78 +
                  ((long)local_64 + (long)(iVar3 + -0x7b2) * 0x16d +
                   (long)*(int *)(time2epoch_month_days_cumulative + (long)iVar13 * 4) +
                  (long)(int)(uVar11 / 400 + ((uVar11 >> 2) - uVar11 / 100) + -0x1dd)) * 0x18) *
                  0x3c) * 0x3c + (long)iVar14 + (long)local_6c + -0x15180;
      return 0;
    }
    if (((byte)(bVar2 - 0x3a) < 0xf6) && ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) {
      while( true ) {
        bVar2 = ((byte *)date)[1];
        date = (char *)((byte *)date + 1);
        if (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)) break;
        if ((bVar2 == 0) || (0xf5 < (byte)(bVar2 - 0x3a))) break;
      }
    }
    if ((byte)((*date & 0xdfU) + 0xbf) < 0x1a) {
      for (max = 0; ((bVar2 = ((byte *)date)[max], (byte)(bVar2 + 0x9f) < 0x1a ||
                     (('@' < (char)bVar2 && (bVar2 < 0x5b)))) && (max < 0xc)); max = max + 1) {
      }
      if (max == 0xc) {
        bVar18 = false;
      }
      else {
        if (iVar12 == -1) {
          ppcVar17 = weekday;
          if (max < 4) {
            iVar12 = -1;
            ppcVar17 = Curl_wkday;
            if (max == 3) goto LAB_00149f4d;
          }
          else {
LAB_00149f4d:
            iVar5 = 0;
            do {
              __s = *ppcVar17;
              sVar10 = strlen(__s);
              if ((sVar10 == max) && (iVar6 = curl_strnequal(date,__s,max), iVar6 != 0)) {
                bVar18 = false;
                iVar12 = iVar5;
              }
              else {
                ppcVar17 = ppcVar17 + 1;
                bVar18 = true;
              }
              if (!bVar18) goto LAB_00149fb9;
              iVar5 = iVar5 + 1;
            } while (iVar5 != 7);
            iVar12 = -1;
          }
LAB_00149fb9:
          bVar18 = iVar12 != -1;
        }
        else {
          bVar18 = false;
        }
        if ((!bVar18) && (iVar13 == -1)) {
          iVar13 = -1;
          if (max == 3) {
            iVar13 = 0;
            ppcVar17 = Curl_month;
            do {
              iVar5 = curl_strnequal(date,*ppcVar17,3);
              if (iVar5 != 0) goto LAB_0014a21f;
              ppcVar17 = ppcVar17 + 1;
              iVar13 = iVar13 + 1;
            } while (iVar13 != 0xc);
            iVar13 = -1;
          }
LAB_0014a21f:
          bVar18 = false;
          if (iVar13 != -1) {
            bVar18 = true;
          }
        }
        if ((!bVar18) && (iVar14 == -1)) {
          iVar14 = -1;
          if (max < 5) {
            iVar5 = 0x45;
            __s_00 = tz;
            iVar14 = iVar12;
            do {
              sVar10 = strlen(__s_00->name);
              if ((sVar10 == max) && (iVar6 = curl_strnequal(date,__s_00->name,max), iVar6 != 0)) {
                iVar14 = __s_00->offset * 0x3c;
                bVar18 = false;
              }
              else {
                __s_00 = __s_00 + 1;
                bVar18 = true;
              }
              if (!bVar18) goto LAB_0014a2c8;
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
            iVar14 = -1;
          }
LAB_0014a2c8:
          bVar18 = false;
          if (iVar14 != -1) {
            bVar18 = true;
          }
        }
      }
      if (bVar18) {
        date = (char *)((byte *)date + max);
        goto LAB_0014a3c5;
      }
      bVar18 = false;
    }
    else {
      if ((byte)(*date - 0x30U) < 10) {
        if (local_6c == -1) {
          bVar18 = 9 < (byte)(((byte *)date)[1] - 0x30);
          pbVar7 = (byte *)date + 2;
          if (bVar18) {
            pbVar7 = (byte *)date + 1;
          }
          iVar5 = (char)((byte *)date)[1] + -0x210 + *date * 10;
          if (bVar18) {
            iVar5 = *date + -0x30;
          }
          if (((iVar5 < 0x18) && (*pbVar7 == 0x3a)) &&
             (bVar2 = pbVar7[1], (byte)(bVar2 - 0x30) < 10)) {
            iVar6 = (char)pbVar7[2] + -0x210 + ((uint)bVar2 + (uint)bVar2 * 4) * 2;
            pbVar8 = pbVar7 + 3;
            if (9 < (byte)(pbVar7[2] - 0x30)) {
              iVar6 = bVar2 - 0x30;
              pbVar8 = pbVar7 + 2;
            }
            if (0x3b < iVar6) goto LAB_0014a035;
            iVar15 = 0;
            if ((*pbVar8 == 0x3a) && (bVar2 = pbVar8[1], (byte)(bVar2 - 0x30) < 10)) {
              pbVar7 = pbVar8 + 2;
              pbVar1 = pbVar8 + 2;
              bVar18 = 9 < (byte)(*pbVar1 - 0x30);
              pbVar8 = pbVar8 + 3;
              if (bVar18) {
                pbVar8 = pbVar7;
              }
              iVar15 = (char)*pbVar1 + -0x210 + ((uint)bVar2 + (uint)bVar2 * 4) * 2;
              if (bVar18) {
                iVar15 = bVar2 - 0x30;
              }
              if (0x3c < iVar15) goto LAB_0014a035;
            }
            local_6c = iVar15;
            bVar18 = true;
            local_68 = iVar6;
            local_48 = pbVar8;
          }
          else {
LAB_0014a035:
            bVar18 = false;
            iVar5 = local_78;
          }
          local_78 = local_68;
          if (!bVar18) goto LAB_0014a062;
          bVar18 = true;
          date = (char *)local_48;
        }
        else {
          local_78 = local_68;
LAB_0014a062:
          piVar9 = __errno_location();
          iVar6 = *piVar9;
          *piVar9 = 0;
          slnum = strtol(date,(char **)&local_48,10);
          iVar15 = *piVar9;
          if (iVar15 != iVar6) {
            *piVar9 = iVar6;
          }
          bVar18 = false;
          local_68 = local_78;
          if ((iVar15 == 0) && (0xfffffffeffffffff < slnum - 0x80000000U)) {
            iVar6 = curlx_sltosi(slnum);
            if (iVar14 == -1) {
              iVar14 = -1;
              bVar18 = false;
              if (((local_38 < date) && (bVar18 = false, (long)local_48 - (long)date == 4)) &&
                 (bVar18 = false, iVar6 < 0x579)) {
                bVar2 = ((byte *)date)[-1];
                if ((bVar2 == 0x2d) || (bVar2 == 0x2b)) {
                  iVar15 = iVar6 + (iVar6 / 100) * -0x28;
                  iVar14 = iVar15 * -0x3c;
                  if (bVar2 != 0x2b) {
                    iVar14 = iVar15 * 0x3c;
                  }
                  bVar18 = true;
                }
                else {
                  bVar18 = false;
                }
              }
            }
            else {
              bVar18 = false;
            }
            if ((((long)local_48 - (long)date == 8) && (iVar3 == -1)) &&
               ((iVar13 == -1 && (local_64 == -1)))) {
              iVar3 = iVar6 / 10000;
              iVar13 = (iVar6 % 10000) / 100 + -1;
              local_64 = iVar6 % 100;
              bVar18 = true;
            }
            iVar15 = -1;
            bVar4 = bVar18;
            if (iVar6 - 1U < 0x1f) {
              bVar4 = true;
              iVar15 = iVar6;
            }
            if ((bool)(!bVar19 & ~bVar18 & local_64 == -1)) {
              bVar19 = true;
              bVar18 = bVar4;
              local_64 = iVar15;
            }
            if (((!bVar18) && (bVar19)) && (iVar3 == -1)) {
              if (iVar6 < 100) {
                if (iVar6 < 0x47) {
                  iVar6 = iVar6 + 2000;
                }
                else {
                  iVar6 = iVar6 + 0x76c;
                }
              }
              bVar19 = local_64 != -1;
              bVar18 = true;
              iVar3 = iVar6;
            }
            if (bVar18) {
              date = (char *)local_48;
            }
          }
        }
        local_78 = iVar5;
        if (!bVar18) {
          bVar18 = false;
          goto LAB_0014a3ca;
        }
      }
LAB_0014a3c5:
      iVar16 = iVar16 + 1;
      bVar18 = true;
    }
LAB_0014a3ca:
    if (!bVar18) {
      return -1;
    }
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      size_t len = 0;
      const char *p = date;
      while(ISALPHA(*p) && (len < NAME_LEN)) {
        p++;
        len++;
      }

      if(len != NAME_LEN) {
        if(wdaynum == -1) {
          wdaynum = checkday(date, len);
          if(wdaynum != -1)
            found = TRUE;
        }
        if(!found && (monnum == -1)) {
          monnum = checkmonth(date, len);
          if(monnum != -1)
            found = TRUE;
        }

        if(!found && (tzoff == -1)) {
          /* this just must be a time zone string */
          tzoff = checktz(date, len);
          if(tzoff != -1)
            found = TRUE;
        }
      }
      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      if((secnum == -1) &&
         match_time(date, &hournum, &minnum, &secnum, &end)) {
        /* time stamp */
        date = end;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate < date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication. 1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+' ? -tzoff : tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val < 32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32-bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32-bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  /* time2epoch() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature a 64 bits 'long' but ultimately time_t is the
     correct data type to use.
  */
  t = time2epoch(secnum, minnum, hournum, mdaynum, monnum, yearnum);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}